

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O1

void * mspace_malloc(mspace msp,size_t bytes)

{
  ulong *puVar1;
  byte *pbVar2;
  ulong *puVar3;
  bool bVar4;
  ulong uVar5;
  size_t dvs;
  ulong uVar6;
  void *pvVar7;
  ulong *puVar8;
  ulong uVar9;
  int *piVar10;
  ulong uVar11;
  undefined8 *puVar12;
  undefined8 *puVar13;
  long lVar14;
  ulong *puVar15;
  byte bVar16;
  uint uVar17;
  uint uVar18;
  char *pcVar19;
  uint uVar20;
  undefined8 *puVar21;
  long lVar22;
  msegmentptr sp;
  ulong *puVar23;
  undefined8 *puVar24;
  ulong uVar25;
  ulong nb;
  undefined8 *unaff_R15;
  
  if (bytes < 0xe9) {
    nb = 0x20;
    if (0x16 < bytes) {
      nb = (ulong)((int)bytes + 0x17U & 0x1f0);
    }
    uVar20 = *msp;
    bVar16 = (byte)(nb >> 3);
    uVar17 = uVar20 >> (bVar16 & 0x1f);
    if ((uVar17 & 3) != 0) {
      uVar18 = (uVar17 & 1 | (uint)(nb >> 3)) ^ 1;
      uVar17 = uVar18 << 4;
      uVar11 = (long)msp + (ulong)uVar17 + 0x48;
      lVar22 = *(long *)((long)msp + (ulong)uVar17 + 0x58);
      uVar6 = *(ulong *)(lVar22 + 0x10);
      if (uVar11 == uVar6) {
        *(uint *)msp = uVar20 & ~(1 << (uVar18 & 0x1f));
      }
      else {
        if ((uVar6 < *(ulong *)((long)msp + 0x18)) || (*(long *)(uVar6 + 0x18) != lVar22))
        goto LAB_001033b9;
        *(ulong *)(uVar6 + 0x18) = uVar11;
        *(ulong *)((long)msp + (ulong)uVar17 + 0x58) = uVar6;
      }
      unaff_R15 = (undefined8 *)(lVar22 + 0x10);
      *(ulong *)(lVar22 + 8) = (ulong)(uVar18 << 3) + 3;
      pbVar2 = (byte *)(lVar22 + 8 + (ulong)(uVar18 << 3));
      *pbVar2 = *pbVar2 | 1;
      goto LAB_00102783;
    }
    uVar6 = *(ulong *)((long)msp + 8);
    bVar4 = true;
    if (uVar6 < nb) {
      if (uVar20 >> (bVar16 & 0x1f) != 0) {
        uVar18 = 2 << (bVar16 & 0x1f);
        uVar18 = (-uVar18 | uVar18) & uVar17 << (bVar16 & 0x1f);
        uVar17 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
          }
        }
        uVar18 = uVar17 << 4;
        uVar25 = (long)msp + (ulong)uVar18 + 0x48;
        lVar22 = *(long *)((long)msp + (ulong)uVar18 + 0x58);
        uVar11 = *(ulong *)(lVar22 + 0x10);
        if (uVar25 == uVar11) {
          *(uint *)msp = uVar20 & ~(1 << (uVar17 & 0x1f));
        }
        else {
          if ((uVar11 < *(ulong *)((long)msp + 0x18)) || (*(long *)(uVar11 + 0x18) != lVar22))
          goto LAB_001033b9;
          *(ulong *)(uVar11 + 0x18) = uVar25;
          *(ulong *)((long)msp + (ulong)uVar18 + 0x58) = uVar11;
        }
        unaff_R15 = (undefined8 *)(lVar22 + 0x10);
        uVar11 = (ulong)(uVar17 << 3);
        uVar25 = uVar11 - nb;
        if (uVar25 < 0x20) {
          *(ulong *)(lVar22 + 8) = uVar11 | 3;
          pbVar2 = (byte *)(lVar22 + 8 + uVar11);
          *pbVar2 = *pbVar2 | 1;
        }
        else {
          *(ulong *)(lVar22 + 8) = nb | 3;
          *(ulong *)(lVar22 + 8 + nb) = uVar25 | 1;
          *(ulong *)(lVar22 + uVar11) = uVar25;
          if (uVar6 != 0) {
            lVar14 = *(long *)((long)msp + 0x20);
            uVar20 = (uint)(uVar6 >> 3);
            uVar11 = (long)msp + (ulong)(uVar20 * 2) * 8 + 0x48;
            if ((*msp >> (uVar20 & 0x1f) & 1) == 0) {
              *(uint *)msp = *msp | 1 << ((byte)(uVar6 >> 3) & 0x1f);
              uVar6 = uVar11;
            }
            else {
              uVar6 = *(ulong *)(uVar11 + 0x10);
              if (*(ulong *)(uVar11 + 0x10) < *(ulong *)((long)msp + 0x18)) goto LAB_001033b9;
            }
            *(long *)(uVar11 + 0x10) = lVar14;
            *(long *)(uVar6 + 0x18) = lVar14;
            *(ulong *)(lVar14 + 0x10) = uVar6;
            *(ulong *)(lVar14 + 0x18) = uVar11;
          }
          *(ulong *)((long)msp + 8) = uVar25;
          *(ulong *)((long)msp + 0x20) = lVar22 + nb;
        }
        goto LAB_00102783;
      }
      uVar17 = *(uint *)((long)msp + 4);
      if (uVar17 != 0) {
        uVar18 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
          }
        }
        puVar24 = *(undefined8 **)((long)msp + (ulong)uVar18 * 8 + 600);
        uVar11 = (puVar24[1] & 0xfffffffffffffff8) - nb;
        puVar12 = puVar24;
        while( true ) {
          puVar13 = (undefined8 *)puVar24[4];
          if (puVar13 == (undefined8 *)0x0) {
            puVar13 = (undefined8 *)puVar24[5];
          }
          if (puVar13 == (undefined8 *)0x0) break;
          uVar25 = (puVar13[1] & 0xfffffffffffffff8) - nb;
          puVar24 = puVar13;
          if (uVar25 < uVar11) {
            uVar11 = uVar25;
            puVar12 = puVar13;
          }
        }
        puVar24 = *(undefined8 **)((long)msp + 0x18);
        if (puVar12 < puVar24) goto LAB_001033b9;
        puVar13 = (undefined8 *)puVar12[3];
        uVar25 = puVar12[6];
        if (puVar13 == puVar12) {
          puVar13 = (undefined8 *)puVar12[5];
          if (puVar13 != (undefined8 *)0x0) {
            puVar21 = puVar12 + 5;
LAB_00103293:
            do {
              if (puVar13[5] == 0) {
                if (puVar13[4] == 0) goto code_r0x001032a7;
                puVar21 = puVar13 + 4;
              }
              else {
                puVar21 = puVar13 + 5;
              }
              puVar13 = (undefined8 *)*puVar21;
            } while( true );
          }
          puVar13 = (undefined8 *)puVar12[4];
          if (puVar13 != (undefined8 *)0x0) {
            puVar21 = puVar12 + 4;
            goto LAB_00103293;
          }
          puVar13 = (undefined8 *)0x0;
        }
        else {
          puVar21 = (undefined8 *)puVar12[2];
          if (((puVar21 < puVar24) || ((undefined8 *)puVar21[3] != puVar12)) ||
             ((undefined8 *)puVar13[2] != puVar12)) goto LAB_001033b9;
          puVar21[3] = puVar13;
          puVar13[2] = puVar21;
        }
        goto LAB_001032b7;
      }
    }
    unaff_R15 = (undefined8 *)0x0;
    goto LAB_001028b2;
  }
  nb = 0xffffffffffffffff;
  if (bytes < 0xffffffffffffff80) {
    nb = bytes + 0x17 & 0xfffffffffffffff0;
    uVar20 = *(uint *)((long)msp + 4);
    if (uVar20 != 0) {
      uVar17 = (uint)(bytes + 0x17 >> 8);
      if (uVar17 == 0) {
        uVar18 = 0;
      }
      else {
        uVar18 = 0x1f;
        if (uVar17 < 0x10000) {
          uVar18 = 0x1f;
          if (uVar17 != 0) {
            for (; uVar17 >> uVar18 == 0; uVar18 = uVar18 - 1) {
            }
          }
          uVar18 = (uint)((nb >> ((ulong)(byte)(0x26 - (char)(uVar18 ^ 0x1f)) & 0x3f) & 1) != 0) +
                   (uVar18 ^ 0x1f) * 2 ^ 0x3e;
        }
      }
      uVar6 = -nb;
      puVar24 = *(undefined8 **)((long)msp + (ulong)uVar18 * 8 + 600);
      unaff_R15 = (undefined8 *)0x0;
      if (puVar24 == (undefined8 *)0x0) {
        puVar24 = (undefined8 *)0x0;
      }
      else {
        bVar16 = 0x39 - (char)(uVar18 >> 1);
        if (uVar18 == 0x1f) {
          bVar16 = 0;
        }
        lVar22 = nb << (bVar16 & 0x3f);
        puVar12 = (undefined8 *)0x0;
        do {
          uVar11 = (puVar24[1] & 0xfffffffffffffff8) - nb;
          if ((uVar11 < uVar6) && (uVar6 = uVar11, unaff_R15 = puVar24, uVar11 == 0)) {
            bVar4 = false;
            uVar6 = 0;
          }
          else {
            puVar13 = (undefined8 *)puVar24[5];
            puVar24 = (undefined8 *)puVar24[4 - (lVar22 >> 0x3f)];
            puVar21 = puVar13;
            if (puVar13 == puVar24) {
              puVar21 = puVar12;
            }
            if (puVar13 != (undefined8 *)0x0) {
              puVar12 = puVar21;
            }
            if (puVar24 == (undefined8 *)0x0) {
              bVar4 = false;
              puVar24 = puVar12;
            }
            else {
              lVar22 = lVar22 * 2;
              bVar4 = true;
            }
          }
        } while (bVar4);
      }
      if (puVar24 == (undefined8 *)0x0 && unaff_R15 == (undefined8 *)0x0) {
        uVar17 = 2 << ((byte)uVar18 & 0x1f);
        uVar17 = (-uVar17 | uVar17) & uVar20;
        if (uVar17 == 0) {
          puVar24 = (undefined8 *)0x0;
        }
        else {
          uVar18 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
            }
          }
          puVar24 = *(undefined8 **)((long)msp + (ulong)uVar18 * 8 + 600);
        }
      }
      while (puVar12 = puVar24, puVar12 != (undefined8 *)0x0) {
        uVar25 = (puVar12[1] & 0xfffffffffffffff8) - nb;
        uVar11 = uVar25;
        if (uVar6 <= uVar25) {
          uVar11 = uVar6;
        }
        if (uVar6 > uVar25) {
          unaff_R15 = puVar12;
        }
        uVar6 = uVar11;
        puVar24 = (undefined8 *)puVar12[4];
        if ((undefined8 *)puVar12[4] == (undefined8 *)0x0) {
          puVar24 = (undefined8 *)puVar12[5];
        }
      }
      if ((unaff_R15 != (undefined8 *)0x0) && (uVar6 < *(long *)((long)msp + 8) - nb)) {
        puVar24 = *(undefined8 **)((long)msp + 0x18);
        if (unaff_R15 < puVar24) goto LAB_001033b9;
        if (0 < (long)nb) {
          puVar12 = (undefined8 *)unaff_R15[3];
          uVar11 = unaff_R15[6];
          if (puVar12 == unaff_R15) {
            puVar12 = (undefined8 *)unaff_R15[5];
            if (puVar12 != (undefined8 *)0x0) {
              puVar13 = unaff_R15 + 5;
LAB_00102e82:
              do {
                if (puVar12[5] == 0) {
                  if (puVar12[4] == 0) goto code_r0x00102e96;
                  puVar13 = puVar12 + 4;
                }
                else {
                  puVar13 = puVar12 + 5;
                }
                puVar12 = (undefined8 *)*puVar13;
              } while( true );
            }
            puVar12 = (undefined8 *)unaff_R15[4];
            if (puVar12 != (undefined8 *)0x0) {
              puVar13 = unaff_R15 + 4;
              goto LAB_00102e82;
            }
            puVar12 = (undefined8 *)0x0;
          }
          else {
            puVar13 = (undefined8 *)unaff_R15[2];
            if (((puVar13 < puVar24) || ((undefined8 *)puVar13[3] != unaff_R15)) ||
               ((undefined8 *)puVar12[2] != unaff_R15)) goto LAB_001033b9;
            puVar13[3] = puVar12;
            puVar12[2] = puVar13;
          }
          goto LAB_00102ea6;
        }
        goto LAB_0010325f;
      }
      unaff_R15 = (undefined8 *)0x0;
      goto LAB_00103268;
    }
  }
  goto LAB_001028bb;
code_r0x001032a7:
  if (puVar21 < puVar24) goto LAB_001033b9;
  *puVar21 = 0;
LAB_001032b7:
  if (uVar25 != 0) {
    uVar18 = *(uint *)(puVar12 + 7);
    if (puVar12 == *(undefined8 **)((long)msp + (ulong)uVar18 * 8 + 600)) {
      *(undefined8 **)((long)msp + (ulong)uVar18 * 8 + 600) = puVar13;
      if (puVar13 == (undefined8 *)0x0) {
        *(uint *)((long)msp + 4) = uVar17 & ~(1 << (uVar18 & 0x1f));
        goto LAB_001032fe;
      }
    }
    else {
      if (uVar25 < *(ulong *)((long)msp + 0x18)) goto LAB_001033b9;
      if (*(undefined8 **)(uVar25 + 0x20) == puVar12) {
        *(undefined8 **)(uVar25 + 0x20) = puVar13;
      }
      else {
        *(undefined8 **)(uVar25 + 0x28) = puVar13;
      }
LAB_001032fe:
      if (puVar13 == (undefined8 *)0x0) goto LAB_00103345;
    }
    puVar24 = *(undefined8 **)((long)msp + 0x18);
    if (puVar13 < puVar24) goto LAB_001033b9;
    puVar13[6] = uVar25;
    puVar21 = (undefined8 *)puVar12[4];
    if (puVar21 != (undefined8 *)0x0) {
      if (puVar21 < puVar24) goto LAB_001033b9;
      puVar13[4] = puVar21;
      puVar21[6] = puVar13;
    }
    uVar25 = puVar12[5];
    if (uVar25 != 0) {
      if (uVar25 < *(ulong *)((long)msp + 0x18)) goto LAB_001033b9;
      puVar13[5] = uVar25;
      *(undefined8 **)(uVar25 + 0x30) = puVar13;
    }
  }
LAB_00103345:
  if (uVar11 < 0x20) {
    puVar12[1] = uVar11 + nb | 3;
    pbVar2 = (byte *)((long)puVar12 + uVar11 + nb + 8);
    *pbVar2 = *pbVar2 | 1;
  }
  else {
    puVar12[1] = nb | 3;
    *(ulong *)((long)puVar12 + nb + 8) = uVar11 | 1;
    *(ulong *)((long)puVar12 + nb + uVar11) = uVar11;
    if (uVar6 != 0) {
      lVar22 = *(long *)((long)msp + 0x20);
      uVar17 = (uint)(uVar6 >> 3);
      uVar25 = (long)msp + (ulong)(uVar17 * 2) * 8 + 0x48;
      if ((uVar20 >> (uVar17 & 0x1f) & 1) == 0) {
        *(uint *)msp = 1 << ((byte)(uVar6 >> 3) & 0x1f) | uVar20;
        uVar6 = uVar25;
      }
      else {
        uVar6 = *(ulong *)((long)msp + (ulong)(uVar17 * 2) * 8 + 0x58);
        if (uVar6 < *(ulong *)((long)msp + 0x18)) goto LAB_001033b9;
      }
      *(long *)((long)msp + (ulong)(uVar17 * 2) * 8 + 0x58) = lVar22;
      *(long *)(uVar6 + 0x18) = lVar22;
      *(ulong *)(lVar22 + 0x10) = uVar6;
      *(ulong *)(lVar22 + 0x18) = uVar25;
    }
    *(ulong *)((long)msp + 8) = uVar11;
    *(ulong *)((long)msp + 0x20) = (long)puVar12 + nb;
  }
  unaff_R15 = puVar12 + 2;
LAB_00102783:
  bVar4 = false;
LAB_001028b2:
  if (!bVar4) {
    return unaff_R15;
  }
  goto LAB_001028bb;
code_r0x00102e96:
  if (puVar13 < puVar24) goto LAB_001033b9;
  *puVar13 = 0;
LAB_00102ea6:
  if (uVar11 != 0) {
    uVar17 = *(uint *)(unaff_R15 + 7);
    if (unaff_R15 == *(undefined8 **)((long)msp + (ulong)uVar17 * 8 + 600)) {
      *(undefined8 **)((long)msp + (ulong)uVar17 * 8 + 600) = puVar12;
      if (puVar12 == (undefined8 *)0x0) {
        *(uint *)((long)msp + 4) = uVar20 & ~(1 << (uVar17 & 0x1f));
        goto LAB_00102ee5;
      }
    }
    else {
      if (uVar11 < *(ulong *)((long)msp + 0x18)) goto LAB_001033b9;
      if (*(undefined8 **)(uVar11 + 0x20) == unaff_R15) {
        *(undefined8 **)(uVar11 + 0x20) = puVar12;
      }
      else {
        *(undefined8 **)(uVar11 + 0x28) = puVar12;
      }
LAB_00102ee5:
      if (puVar12 == (undefined8 *)0x0) goto LAB_00102f30;
    }
    puVar24 = *(undefined8 **)((long)msp + 0x18);
    if (puVar12 < puVar24) goto LAB_001033b9;
    puVar12[6] = uVar11;
    puVar13 = (undefined8 *)unaff_R15[4];
    if (puVar13 != (undefined8 *)0x0) {
      if (puVar13 < puVar24) goto LAB_001033b9;
      puVar12[4] = puVar13;
      puVar13[6] = puVar12;
    }
    uVar11 = unaff_R15[5];
    if (uVar11 != 0) {
      if (uVar11 < *(ulong *)((long)msp + 0x18)) goto LAB_001033b9;
      puVar12[5] = uVar11;
      *(undefined8 **)(uVar11 + 0x30) = puVar12;
    }
  }
LAB_00102f30:
  if (uVar6 < 0x20) {
    unaff_R15[1] = uVar6 + nb | 3;
    pbVar2 = (byte *)((long)unaff_R15 + uVar6 + nb + 8);
    *pbVar2 = *pbVar2 | 1;
  }
  else {
    uVar11 = (long)unaff_R15 + nb;
    unaff_R15[1] = nb | 3;
    *(ulong *)((long)unaff_R15 + nb + 8) = uVar6 | 1;
    *(ulong *)(uVar11 + uVar6) = uVar6;
    if (uVar6 < 0x100) {
      uVar6 = uVar6 >> 3;
      uVar25 = (long)msp + uVar6 * 0x10 + 0x48;
      if ((*msp >> ((uint)uVar6 & 0x1f) & 1) == 0) {
        *(uint *)msp = *msp | 1 << ((byte)uVar6 & 0x1f);
        uVar9 = uVar25;
      }
      else {
        uVar9 = *(ulong *)((long)msp + uVar6 * 0x10 + 0x58);
        if (uVar9 < *(ulong *)((long)msp + 0x18)) goto LAB_001033b9;
      }
      *(ulong *)((long)msp + uVar6 * 0x10 + 0x58) = uVar11;
      *(ulong *)(uVar9 + 0x18) = uVar11;
      *(ulong *)(uVar11 + 0x10) = uVar9;
      *(ulong *)(uVar11 + 0x18) = uVar25;
    }
    else {
      uVar20 = (uint)(uVar6 >> 8);
      if (uVar20 == 0) {
        uVar17 = 0;
      }
      else {
        uVar17 = 0x1f;
        if (uVar20 < 0x10000) {
          uVar17 = 0x1f;
          if (uVar20 != 0) {
            for (; uVar20 >> uVar17 == 0; uVar17 = uVar17 - 1) {
            }
          }
          uVar17 = (uint)((uVar6 >> ((ulong)(byte)(0x26 - (char)(uVar17 ^ 0x1f)) & 0x3f) & 1) != 0)
                   + (uVar17 ^ 0x1f) * 2 ^ 0x3e;
        }
      }
      puVar8 = (ulong *)((long)msp + (ulong)uVar17 * 8 + 600);
      *(uint *)(uVar11 + 0x38) = uVar17;
      *(undefined8 *)(uVar11 + 0x20) = 0;
      *(undefined8 *)(uVar11 + 0x28) = 0;
      if ((*(uint *)((long)msp + 4) >> (uVar17 & 0x1f) & 1) == 0) {
        *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar17 & 0x1f);
        *puVar8 = uVar11;
        *(ulong **)(uVar11 + 0x30) = puVar8;
        *(ulong *)(uVar11 + 0x18) = uVar11;
        *(ulong *)(uVar11 + 0x10) = uVar11;
      }
      else {
        uVar25 = *puVar8;
        bVar16 = 0x39 - (char)(uVar17 >> 1);
        if (uVar17 == 0x1f) {
          bVar16 = 0;
        }
        lVar22 = uVar6 << (bVar16 & 0x3f);
        do {
          if ((*(ulong *)(uVar25 + 8) & 0xfffffffffffffff8) == uVar6) {
            if ((uVar25 < *(ulong *)((long)msp + 0x18)) ||
               (uVar6 = *(ulong *)(uVar25 + 0x10), uVar6 < *(ulong *)((long)msp + 0x18)))
            goto LAB_001033b9;
            *(ulong *)(uVar6 + 0x18) = uVar11;
            *(ulong *)(uVar25 + 0x10) = uVar11;
            *(ulong *)(uVar11 + 0x10) = uVar6;
            *(ulong *)(uVar11 + 0x18) = uVar25;
            *(undefined8 *)(uVar11 + 0x30) = 0;
            break;
          }
          uVar9 = *(ulong *)(uVar25 + 0x20 + (lVar22 >> 0x3f) * -8);
          uVar5 = uVar9;
          if (uVar9 == 0) {
            puVar8 = (ulong *)(uVar25 + (lVar22 >> 0x3f) * -8 + 0x20);
            if (puVar8 < *(ulong **)((long)msp + 0x18)) goto LAB_001033b9;
            *puVar8 = uVar11;
            *(ulong *)(uVar11 + 0x30) = uVar25;
            *(ulong *)(uVar11 + 0x18) = uVar11;
            *(ulong *)(uVar11 + 0x10) = uVar11;
            uVar5 = uVar25;
          }
          uVar25 = uVar5;
          lVar22 = lVar22 * 2;
        } while (uVar9 != 0);
      }
    }
  }
  unaff_R15 = unaff_R15 + 2;
LAB_0010325f:
  if ((long)nb < 1) goto LAB_001033b9;
LAB_00103268:
  if (unaff_R15 != (undefined8 *)0x0) {
    return unaff_R15;
  }
LAB_001028bb:
  uVar6 = *(ulong *)((long)msp + 8);
  uVar11 = uVar6 - nb;
  if (uVar6 < nb) {
    uVar6 = *(ulong *)((long)msp + 0x10) - nb;
    if (*(ulong *)((long)msp + 0x10) < nb || uVar6 == 0) {
      if (mparams.magic == 0) {
        init_mparams();
      }
      if ((((*(byte *)((long)msp + 0x370) & 1) != 0) && (mparams.mmap_threshold <= nb)) &&
         (*(long *)((long)msp + 0x10) != 0)) {
        uVar6 = -mparams.page_size & nb + mparams.page_size + 0x3e;
        if (((*(ulong *)((long)msp + 0x368) == 0) ||
            (uVar11 = *(ulong *)((long)msp + 0x358) + uVar6,
            uVar11 <= *(ulong *)((long)msp + 0x368) && *(ulong *)((long)msp + 0x358) < uVar11)) &&
           (nb < uVar6)) {
          unaff_R15 = (undefined8 *)0x0;
          pvVar7 = mmap((void *)0x0,uVar6,3,0x22,-1,0);
          if (pvVar7 != (void *)0xffffffffffffffff) {
            uVar11 = (ulong)(-(int)pvVar7 - 0x10U & 0xf);
            *(ulong *)((long)pvVar7 + uVar11) = uVar11;
            *(ulong *)((long)pvVar7 + uVar11 + 8) = (uVar6 - uVar11) + -0x20;
            *(undefined8 *)((long)pvVar7 + (uVar6 - uVar11) + -0x18 + uVar11) = 0xb;
            *(undefined8 *)((long)pvVar7 + (uVar6 - 0x10)) = 0;
            if ((*(void **)((long)msp + 0x18) == (void *)0x0) ||
               (pvVar7 < *(void **)((long)msp + 0x18))) {
              *(void **)((long)msp + 0x18) = pvVar7;
            }
            uVar6 = uVar6 + *(long *)((long)msp + 0x358);
            *(ulong *)((long)msp + 0x358) = uVar6;
            if (*(ulong *)((long)msp + 0x360) < uVar6) {
              *(ulong *)((long)msp + 0x360) = uVar6;
            }
            unaff_R15 = (undefined8 *)((long)pvVar7 + uVar11 + 0x10);
          }
          if (pvVar7 == (void *)0xffffffffffffffff) goto LAB_00102a32;
        }
        else {
LAB_00102a32:
          unaff_R15 = (undefined8 *)0x0;
        }
        if (unaff_R15 != (undefined8 *)0x0) {
          return unaff_R15;
        }
      }
      uVar6 = -mparams.granularity & nb + mparams.granularity + 0x5f;
      if (uVar6 <= nb) {
        return (void *)0x0;
      }
      if ((*(ulong *)((long)msp + 0x368) != 0) &&
         (uVar11 = *(ulong *)((long)msp + 0x358) + uVar6,
         *(ulong *)((long)msp + 0x368) < uVar11 || uVar11 <= *(ulong *)((long)msp + 0x358))) {
        return (void *)0x0;
      }
      puVar8 = (ulong *)mmap((void *)0x0,uVar6,3,0x22,-1,0);
      if (puVar8 == (ulong *)0xffffffffffffffff) {
LAB_00103558:
        piVar10 = __errno_location();
        *piVar10 = 0xc;
        return (void *)0x0;
      }
      uVar11 = *(long *)((long)msp + 0x358) + uVar6;
      *(ulong *)((long)msp + 0x358) = uVar11;
      if (*(ulong *)((long)msp + 0x360) < uVar11) {
        *(ulong *)((long)msp + 0x360) = uVar11;
      }
      puVar3 = *(ulong **)((long)msp + 0x28);
      uVar20 = (uint)(puVar8 != (ulong *)0xffffffffffffffff);
      if (puVar3 == (ulong *)0x0) {
        if ((*(ulong **)((long)msp + 0x18) == (ulong *)0x0) ||
           (puVar8 < *(ulong **)((long)msp + 0x18))) {
          *(ulong **)((long)msp + 0x18) = puVar8;
        }
        *(ulong **)((long)msp + 0x378) = puVar8;
        *(ulong *)((long)msp + 0x380) = uVar6;
        *(uint *)((long)msp + 0x390) = uVar20;
        *(size_t *)((long)msp + 0x40) = mparams.magic;
        *(undefined8 *)((long)msp + 0x38) = 0xfff;
        lVar22 = (long)msp + 0x48;
        lVar14 = 0x20;
        do {
          *(long *)(lVar22 + 0x18) = lVar22;
          *(long *)(lVar22 + 0x10) = lVar22;
          lVar22 = lVar22 + 0x10;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
        uVar11 = *(ulong *)((long)msp + -8) & 0xfffffffffffffff8;
        lVar14 = (long)msp + (uVar11 - 0x10);
        uVar25 = (ulong)(-(int)lVar14 - 0x10U & 0xf);
        lVar22 = uVar25 + uVar11;
        pcVar19 = (char *)((long)puVar8 + ((uVar6 - lVar14) - uVar25) + -0x50);
        *(long *)((long)msp + 0x28) = (long)msp + lVar22 + -0x10;
        *(char **)((long)msp + 0x10) = pcVar19;
        *(ulong *)((long)msp + lVar22 + -8) = (ulong)pcVar19 | 1;
        pcVar19 = (char *)((long)puVar8 + (uVar6 - 0x48));
        pcVar19[0] = 'P';
        pcVar19[1] = '\0';
        pcVar19[2] = '\0';
        pcVar19[3] = '\0';
        pcVar19[4] = '\0';
        pcVar19[5] = '\0';
        pcVar19[6] = '\0';
        pcVar19[7] = '\0';
        *(size_t *)((long)msp + 0x30) = mparams.trim_threshold;
      }
      else {
        puVar1 = (ulong *)((long)msp + 0x378);
        puVar15 = puVar1;
        do {
          puVar23 = (ulong *)((long)*puVar15 + puVar15[1]);
          if (puVar8 == puVar23) {
            if ((((puVar3 < puVar23) && ((ulong *)*puVar15 <= puVar3)) && ((puVar15[3] & 8) == 0))
               && ((puVar15[3] & 1) != 0)) {
              puVar15[1] = puVar15[1] + uVar6;
              lVar22 = uVar6 + *(long *)((long)msp + 0x10);
              uVar6 = (ulong)(-(int)puVar3 - 0x10U & 0xf);
              uVar11 = lVar22 - uVar6;
              *(char **)((long)msp + 0x28) = (char *)((long)puVar3 + uVar6);
              *(ulong *)((long)msp + 0x10) = uVar11;
              *(ulong *)((long)puVar3 + uVar6 + 8) = uVar11 | 1;
              pcVar19 = (char *)((long)puVar3 + lVar22 + 8);
              pcVar19[0] = 'P';
              pcVar19[1] = '\0';
              pcVar19[2] = '\0';
              pcVar19[3] = '\0';
              pcVar19[4] = '\0';
              pcVar19[5] = '\0';
              pcVar19[6] = '\0';
              pcVar19[7] = '\0';
              *(size_t *)((long)msp + 0x30) = mparams.trim_threshold;
              bVar4 = true;
              goto LAB_00103543;
            }
            break;
          }
          puVar15 = (ulong *)puVar15[2];
        } while (puVar15 != (ulong *)0x0);
        if (puVar8 < *(ulong **)((long)msp + 0x18)) {
          *(ulong **)((long)msp + 0x18) = puVar8;
        }
        puVar15 = puVar1;
        do {
          pcVar19 = (char *)*puVar15;
          puVar23 = puVar1;
          if (pcVar19 == (char *)((long)puVar8 + uVar6)) {
            if ((((uint)puVar15[3] & 8) == 0 & (byte)(uint)puVar15[3]) != 0) {
              *puVar15 = (ulong)puVar8;
              puVar15[1] = puVar15[1] + uVar6;
              unaff_R15 = (undefined8 *)prepend_alloc((mstate)msp,(char *)puVar8,pcVar19,nb);
              bVar4 = false;
              goto LAB_00103543;
            }
            break;
          }
          puVar15 = (ulong *)puVar15[2];
        } while (puVar15 != (ulong *)0x0);
        for (; (puVar3 < (ulong *)*puVar23 ||
               (puVar15 = (ulong *)((long)*puVar23 + puVar23[1]), puVar15 <= puVar3));
            puVar23 = (ulong *)puVar23[2]) {
        }
        puVar23 = (ulong *)((long)puVar15 + ((ulong)(0x4fU - (int)puVar15 & 0xf) - 0x5f));
        if (puVar23 < puVar3 + 4) {
          puVar23 = puVar3;
        }
        uVar11 = (ulong)(-(int)puVar8 - 0x10U & 0xf);
        uVar25 = (uVar6 - 0x50) - uVar11;
        *(char **)((long)msp + 0x28) = (char *)((long)puVar8 + uVar11);
        *(ulong *)((long)msp + 0x10) = uVar25;
        *(ulong *)((long)puVar8 + uVar11 + 8) = uVar25 | 1;
        pcVar19 = (char *)((long)puVar8 + (uVar6 - 0x48));
        pcVar19[0] = 'P';
        pcVar19[1] = '\0';
        pcVar19[2] = '\0';
        pcVar19[3] = '\0';
        pcVar19[4] = '\0';
        pcVar19[5] = '\0';
        pcVar19[6] = '\0';
        pcVar19[7] = '\0';
        *(size_t *)((long)msp + 0x30) = mparams.trim_threshold;
        puVar23[1] = 0x33;
        uVar11 = *(ulong *)((long)msp + 0x380);
        uVar25 = *(ulong *)((long)msp + 0x388);
        uVar9 = *(ulong *)((long)msp + 0x390);
        puVar23[2] = *puVar1;
        puVar23[3] = uVar11;
        puVar23[4] = uVar25;
        puVar23[5] = uVar9;
        *(ulong **)((long)msp + 0x378) = puVar8;
        *(ulong *)((long)msp + 0x380) = uVar6;
        *(uint *)((long)msp + 0x390) = uVar20;
        *(ulong **)((long)msp + 0x388) = puVar23 + 2;
        puVar8 = puVar23 + 6;
        do {
          puVar8[1] = 0xb;
          puVar1 = puVar8 + 2;
          puVar8 = puVar8 + 1;
        } while (puVar1 < puVar15);
        bVar4 = true;
        uVar6 = (long)puVar23 - (long)puVar3;
        if (uVar6 != 0) {
          *(byte *)(puVar23 + 1) = (byte)puVar23[1] & 0xfe;
          puVar3[1] = uVar6 | 1;
          *puVar23 = uVar6;
          if (uVar6 < 0x100) {
            uVar6 = uVar6 >> 3;
            uVar11 = (long)msp + uVar6 * 0x10 + 0x48;
            if ((*msp >> ((uint)uVar6 & 0x1f) & 1) == 0) {
              *(uint *)msp = *msp | 1 << ((byte)uVar6 & 0x1f);
              uVar25 = uVar11;
            }
            else {
              uVar25 = *(ulong *)((long)msp + uVar6 * 0x10 + 0x58);
              if (uVar25 < *(ulong *)((long)msp + 0x18)) {
LAB_001033b9:
                abort();
              }
            }
            *(ulong **)((long)msp + uVar6 * 0x10 + 0x58) = puVar3;
            *(ulong **)(uVar25 + 0x18) = puVar3;
            puVar3[2] = uVar25;
            puVar3[3] = uVar11;
          }
          else {
            uVar20 = (uint)(uVar6 >> 8);
            if (uVar20 == 0) {
              uVar17 = 0;
            }
            else {
              uVar17 = 0x1f;
              if (uVar20 < 0x10000) {
                uVar17 = 0x1f;
                if (uVar20 != 0) {
                  for (; uVar20 >> uVar17 == 0; uVar17 = uVar17 - 1) {
                  }
                }
                uVar17 = (uint)((uVar6 >> ((ulong)(byte)(0x26 - (char)(uVar17 ^ 0x1f)) & 0x3f) & 1)
                               != 0) + (uVar17 ^ 0x1f) * 2 ^ 0x3e;
              }
            }
            puVar8 = (ulong *)((long)msp + (ulong)uVar17 * 8 + 600);
            *(uint *)(puVar3 + 7) = uVar17;
            puVar3[4] = 0;
            puVar3[5] = 0;
            if ((*(uint *)((long)msp + 4) >> (uVar17 & 0x1f) & 1) == 0) {
              *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar17 & 0x1f);
              *puVar8 = (ulong)puVar3;
              puVar3[6] = (ulong)puVar8;
              puVar3[3] = (ulong)puVar3;
              puVar3[2] = (ulong)puVar3;
            }
            else {
              uVar11 = *puVar8;
              bVar16 = 0x39 - (char)(uVar17 >> 1);
              if (uVar17 == 0x1f) {
                bVar16 = 0;
              }
              lVar22 = uVar6 << (bVar16 & 0x3f);
              do {
                if ((*(ulong *)(uVar11 + 8) & 0xfffffffffffffff8) == uVar6) {
                  if ((uVar11 < *(ulong *)((long)msp + 0x18)) ||
                     (uVar6 = *(ulong *)(uVar11 + 0x10), uVar6 < *(ulong *)((long)msp + 0x18)))
                  goto LAB_001033b9;
                  *(ulong **)(uVar6 + 0x18) = puVar3;
                  *(ulong **)(uVar11 + 0x10) = puVar3;
                  puVar3[2] = uVar6;
                  puVar3[3] = uVar11;
                  puVar3[6] = 0;
                  break;
                }
                uVar25 = *(ulong *)(uVar11 + 0x20 + (lVar22 >> 0x3f) * -8);
                uVar9 = uVar25;
                if (uVar25 == 0) {
                  puVar24 = (undefined8 *)(uVar11 + (lVar22 >> 0x3f) * -8 + 0x20);
                  if (puVar24 < *(undefined8 **)((long)msp + 0x18)) goto LAB_001033b9;
                  *puVar24 = puVar3;
                  puVar3[6] = uVar11;
                  puVar3[3] = (ulong)puVar3;
                  puVar3[2] = (ulong)puVar3;
                  uVar9 = uVar11;
                }
                uVar11 = uVar9;
                lVar22 = lVar22 * 2;
              } while (uVar25 != 0);
            }
          }
        }
LAB_00103543:
        if (!bVar4) {
          return unaff_R15;
        }
      }
      uVar6 = *(ulong *)((long)msp + 0x10) - nb;
      if (*(ulong *)((long)msp + 0x10) < nb || uVar6 == 0) goto LAB_00103558;
    }
    *(ulong *)((long)msp + 0x10) = uVar6;
    lVar22 = *(long *)((long)msp + 0x28);
    *(ulong *)((long)msp + 0x28) = lVar22 + nb;
    *(ulong *)(lVar22 + 8 + nb) = uVar6 | 1;
  }
  else {
    lVar22 = *(long *)((long)msp + 0x20);
    if (uVar11 < 0x20) {
      *(undefined8 *)((long)msp + 8) = 0;
      *(undefined8 *)((long)msp + 0x20) = 0;
      *(ulong *)(lVar22 + 8) = uVar6 | 3;
      pbVar2 = (byte *)(lVar22 + 8 + uVar6);
      *pbVar2 = *pbVar2 | 1;
      goto LAB_00102a57;
    }
    *(ulong *)((long)msp + 0x20) = lVar22 + nb;
    *(ulong *)((long)msp + 8) = uVar11;
    *(ulong *)(lVar22 + 8 + nb) = uVar11 | 1;
    *(ulong *)(lVar22 + uVar6) = uVar11;
  }
  *(ulong *)(lVar22 + 8) = nb | 3;
LAB_00102a57:
  return (void *)(lVar22 + 0x10);
}

Assistant:

void* mspace_malloc(mspace msp, size_t bytes) {
  mstate ms = (mstate)msp;
  if (!ok_magic(ms)) {
    USAGE_ERROR_ACTION(ms,ms);
    return 0;
  }
  if (!PREACTION(ms)) {
    void* mem;
    size_t nb;
    if (bytes <= MAX_SMALL_REQUEST) {
      bindex_t idx;
      binmap_t smallbits;
      nb = (bytes < MIN_REQUEST)? MIN_CHUNK_SIZE : pad_request(bytes);
      idx = small_index(nb);
      smallbits = ms->smallmap >> idx;

      if ((smallbits & 0x3U) != 0) { /* Remainderless fit to a smallbin. */
        mchunkptr b, p;
        idx += ~smallbits & 1;       /* Uses next bin if idx empty */
        b = smallbin_at(ms, idx);
        p = b->fd;
        assert(chunksize(p) == small_index2size(idx));
        unlink_first_small_chunk(ms, b, p, idx);
        set_inuse_and_pinuse(ms, p, small_index2size(idx));
        mem = chunk2mem(p);
        check_malloced_chunk(ms, mem, nb);
        goto postaction;
      }

      else if (nb > ms->dvsize) {
        if (smallbits != 0) { /* Use chunk in next nonempty smallbin */
          mchunkptr b, p, r;
          size_t rsize;
          bindex_t i;
          binmap_t leftbits = (smallbits << idx) & left_bits(idx2bit(idx));
          binmap_t leastbit = least_bit(leftbits);
          compute_bit2idx(leastbit, i);
          b = smallbin_at(ms, i);
          p = b->fd;
          assert(chunksize(p) == small_index2size(i));
          unlink_first_small_chunk(ms, b, p, i);
          rsize = small_index2size(i) - nb;
          /* Fit here cannot be remainderless if 4byte sizes */
          if (SIZE_T_SIZE != 4 && rsize < MIN_CHUNK_SIZE)
            set_inuse_and_pinuse(ms, p, small_index2size(i));
          else {
            set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
            r = chunk_plus_offset(p, nb);
            set_size_and_pinuse_of_free_chunk(r, rsize);
            replace_dv(ms, r, rsize);
          }
          mem = chunk2mem(p);
          check_malloced_chunk(ms, mem, nb);
          goto postaction;
        }

        else if (ms->treemap != 0 && (mem = tmalloc_small(ms, nb)) != 0) {
          check_malloced_chunk(ms, mem, nb);
          goto postaction;
        }
      }
    }
    else if (bytes >= MAX_REQUEST)
      nb = MAX_SIZE_T; /* Too big to allocate. Force failure (in sys alloc) */
    else {
      nb = pad_request(bytes);
      if (ms->treemap != 0 && (mem = tmalloc_large(ms, nb)) != 0) {
        check_malloced_chunk(ms, mem, nb);
        goto postaction;
      }
    }

    if (nb <= ms->dvsize) {
      size_t rsize = ms->dvsize - nb;
      mchunkptr p = ms->dv;
      if (rsize >= MIN_CHUNK_SIZE) { /* split dv */
        mchunkptr r = ms->dv = chunk_plus_offset(p, nb);
        ms->dvsize = rsize;
        set_size_and_pinuse_of_free_chunk(r, rsize);
        set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
      }
      else { /* exhaust dv */
        size_t dvs = ms->dvsize;
        ms->dvsize = 0;
        ms->dv = 0;
        set_inuse_and_pinuse(ms, p, dvs);
      }
      mem = chunk2mem(p);
      check_malloced_chunk(ms, mem, nb);
      goto postaction;
    }

    else if (nb < ms->topsize) { /* Split top */
      size_t rsize = ms->topsize -= nb;
      mchunkptr p = ms->top;
      mchunkptr r = ms->top = chunk_plus_offset(p, nb);
      r->head = rsize | PINUSE_BIT;
      set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
      mem = chunk2mem(p);
      check_top_chunk(ms, ms->top);
      check_malloced_chunk(ms, mem, nb);
      goto postaction;
    }

    mem = sys_alloc(ms, nb);

  postaction:
    POSTACTION(ms);
    return mem;
  }

  return 0;
}